

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool ts_parser__recover_to_state
                (TSParser *self,StackVersion version,uint depth,TSStateId goal_state)

{
  undefined4 uVar1;
  TSStateId TVar2;
  StackSlice *pSVar3;
  Subtree SVar4;
  Subtree tree;
  uint j_1;
  Subtree error;
  SubtreeArray trailing_extras;
  uint j;
  uint32_t error_child_count;
  Subtree error_tree;
  SubtreeArray error_trees;
  StackSlice slice;
  uint i;
  StackVersion previous_version;
  StackSliceArray pop;
  TSStateId goal_state_local;
  uint depth_local;
  StackVersion version_local;
  TSParser *self_local;
  
  pop.capacity._2_2_ = goal_state;
  _i = ts_stack_pop_count(self->stack,version,depth);
  slice._20_4_ = 0xffffffff;
  slice.version = 0;
  do {
    if ((uint)pop.contents <= slice.version) {
      return slice._20_4_ != -1;
    }
    pSVar3 = _i + slice.version;
    error_trees._8_8_ = (pSVar3->subtrees).contents;
    uVar1 = (pSVar3->subtrees).size;
    slice.subtrees.size = (uint32_t)*(undefined8 *)&pSVar3->version;
    if (slice.subtrees.size == slice._20_4_) {
      ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&error_trees.size);
      array__erase((VoidArray *)&i,0x18,slice.version);
      slice.version = slice.version - 1;
    }
    else {
      TVar2 = ts_stack_state(self->stack,slice.subtrees.size);
      if (TVar2 == pop.capacity._2_2_) {
        _error_tree = ts_stack_pop_error(self->stack,slice.subtrees.size);
        if ((uint32_t)error_trees.contents != 0) {
          if ((uint32_t)error_trees.contents != 1) {
            __assert_fail("error_trees.size == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                          ,0x40e,
                          "_Bool ts_parser__recover_to_state(TSParser *, StackVersion, unsigned int, TSStateId)"
                         );
          }
          SVar4.data = *error_tree.data;
          trailing_extras.capacity = ts_subtree_child_count(SVar4);
          if (trailing_extras.capacity != 0) {
            array__splice((VoidArray *)&error_trees.size,8,0,0,trailing_extras.capacity,
                          ((SVar4.ptr)->field_17).field_0.children);
            for (trailing_extras.size = 0; trailing_extras.size < trailing_extras.capacity;
                trailing_extras.size = trailing_extras.size + 1) {
              ts_subtree_retain(*(Subtree *)(error_trees._8_8_ + (ulong)trailing_extras.size * 8));
            }
          }
          ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&error_tree.data);
        }
        _error = ts_subtree_array_remove_trailing_extras((SubtreeArray *)&error_trees.size);
        if (uVar1 == 0) {
          array__delete((VoidArray *)&error_trees.size);
        }
        else {
          SVar4 = ts_subtree_new_error_node
                            (&self->tree_pool,(SubtreeArray *)&error_trees.size,true,self->language)
          ;
          ts_stack_push(self->stack,slice.subtrees.size,SVar4,false,pop.capacity._2_2_);
        }
        for (tree._4_4_ = 0; (uint)tree._4_4_ < (uint)trailing_extras.contents;
            tree._4_4_ = tree._4_4_ + 1) {
          ts_stack_push(self->stack,slice.subtrees.size,
                        *(Subtree *)(&(error.ptr)->ref_count + (ulong)(uint)tree._4_4_ * 2),false,
                        pop.capacity._2_2_);
        }
        slice._20_4_ = slice.subtrees.size;
        array__delete((VoidArray *)&error.data);
      }
      else {
        ts_stack_halt(self->stack,slice.subtrees.size);
        ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&error_trees.size);
        array__erase((VoidArray *)&i,0x18,slice.version);
        slice.version = slice.version - 1;
      }
    }
    slice.version = slice.version + 1;
  } while( true );
}

Assistant:

static bool ts_parser__recover_to_state(TSParser *self, StackVersion version, unsigned depth,
                                        TSStateId goal_state) {
  StackSliceArray pop = ts_stack_pop_count(self->stack, version, depth);
  StackVersion previous_version = STACK_VERSION_NONE;

  for (unsigned i = 0; i < pop.size; i++) {
    StackSlice slice = pop.contents[i];

    if (slice.version == previous_version) {
      ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
      array_erase(&pop, i--);
      continue;
    }

    if (ts_stack_state(self->stack, slice.version) != goal_state) {
      ts_stack_halt(self->stack, slice.version);
      ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
      array_erase(&pop, i--);
      continue;
    }

    SubtreeArray error_trees = ts_stack_pop_error(self->stack, slice.version);
    if (error_trees.size > 0) {
      assert(error_trees.size == 1);
      Subtree error_tree = error_trees.contents[0];
      uint32_t error_child_count = ts_subtree_child_count(error_tree);
      if (error_child_count > 0) {
        array_splice(&slice.subtrees, 0, 0, error_child_count, error_tree.ptr->children);
        for (unsigned j = 0; j < error_child_count; j++) {
          ts_subtree_retain(slice.subtrees.contents[j]);
        }
      }
      ts_subtree_array_delete(&self->tree_pool, &error_trees);
    }

    SubtreeArray trailing_extras = ts_subtree_array_remove_trailing_extras(&slice.subtrees);

    if (slice.subtrees.size > 0) {
      Subtree error = ts_subtree_new_error_node(&self->tree_pool, &slice.subtrees, true, self->language);
      ts_stack_push(self->stack, slice.version, error, false, goal_state);
    } else {
      array_delete(&slice.subtrees);
    }

    for (unsigned j = 0; j < trailing_extras.size; j++) {
      Subtree tree = trailing_extras.contents[j];
      ts_stack_push(self->stack, slice.version, tree, false, goal_state);
    }

    previous_version = slice.version;
    array_delete(&trailing_extras);
  }

  return previous_version != STACK_VERSION_NONE;
}